

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool anon_unknown.dwarf_67a627::DeduceVersionProfile
               (TInfoSink *infoSink,EShLanguage stage,bool versionNotFirst,int defaultVersion,
               EShSource source,int *version,EProfile *profile,SpvVersion *spvVersion)

{
  EProfile EVar1;
  int iVar2;
  bool local_35;
  bool correct;
  int FirstProfileVersion;
  int *version_local;
  EShSource source_local;
  int defaultVersion_local;
  bool versionNotFirst_local;
  EShLanguage stage_local;
  TInfoSink *infoSink_local;
  
  infoSink_local._7_1_ = true;
  if (source == EShSourceHlsl) {
    *version = 500;
    *profile = ECoreProfile;
    infoSink_local._7_1_ = true;
  }
  else {
    if (*version == 0) {
      *version = defaultVersion;
    }
    if (*profile == ENoProfile) {
      if (((*version == 300) || (*version == 0x136)) || (*version == 0x140)) {
        infoSink_local._7_1_ = false;
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: versions 300, 310, and 320 require specifying the \'es\' profile");
        *profile = EEsProfile;
      }
      else if (*version == 100) {
        *profile = EEsProfile;
      }
      else if (*version < 0x96) {
        *profile = ENoProfile;
      }
      else {
        *profile = ECoreProfile;
      }
    }
    else if (*version < 0x96) {
      infoSink_local._7_1_ = false;
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: versions before 150 do not allow a profile token");
      if (*version == 100) {
        *profile = EEsProfile;
      }
      else {
        *profile = ENoProfile;
      }
    }
    else if (((*version == 300) || (*version == 0x136)) || (*version == 0x140)) {
      EVar1 = *profile;
      if (EVar1 != EEsProfile) {
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: versions 300, 310, and 320 support only the es profile");
      }
      local_35 = EVar1 == EEsProfile;
      *profile = EEsProfile;
      infoSink_local._7_1_ = local_35;
    }
    else if (*profile == EEsProfile) {
      infoSink_local._7_1_ = false;
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: only version 300, 310, and 320 support the es profile");
      if (*version < 0x96) {
        *profile = ENoProfile;
      }
      else {
        *profile = ECoreProfile;
      }
    }
    iVar2 = *version;
    if (((((iVar2 != 100) && (iVar2 != 0x6e)) &&
         ((iVar2 != 0x78 &&
          (((((iVar2 != 0x82 && (iVar2 != 0x8c)) && (iVar2 != 0x96)) &&
            ((iVar2 != 300 && (iVar2 != 0x136)))) && (iVar2 != 0x140)))))) &&
        ((iVar2 != 0x14a && (iVar2 != 400)))) &&
       ((iVar2 != 0x19a &&
        ((((iVar2 != 0x1a4 && (iVar2 != 0x1ae)) && (iVar2 != 0x1b8)) &&
         ((iVar2 != 0x1c2 && (iVar2 != 0x1cc)))))))) {
      infoSink_local._7_1_ = false;
      glslang::TInfoSinkBase::message(&infoSink->info,EPrefixError,"version not supported");
      if (*profile == EEsProfile) {
        *version = 0x136;
      }
      else {
        *version = 0x1c2;
        *profile = ECoreProfile;
      }
    }
    switch(stage) {
    case EShLangTessControl:
    case EShLangTessEvaluation:
      if (((*profile == EEsProfile) && (*version < 0x136)) ||
         ((*profile != EEsProfile && (*version < 0x96)))) {
        infoSink_local._7_1_ = false;
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: tessellation shaders require es profile with version 310 or non-es profile with version 150 or above"
                  );
        iVar2 = 400;
        if (*profile == EEsProfile) {
          iVar2 = 0x136;
        }
        *version = iVar2;
        if ((*profile == EEsProfile) || (*profile == ENoProfile)) {
          *profile = ECoreProfile;
        }
      }
      break;
    case EShLangGeometry:
      if (((*profile == EEsProfile) && (*version < 0x136)) ||
         ((*profile != EEsProfile && (*version < 0x96)))) {
        infoSink_local._7_1_ = false;
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: geometry shaders require es profile with version 310 or non-es profile with version 150 or above"
                  );
        iVar2 = 0x96;
        if (*profile == EEsProfile) {
          iVar2 = 0x136;
        }
        *version = iVar2;
        if ((*profile == EEsProfile) || (*profile == ENoProfile)) {
          *profile = ECoreProfile;
        }
      }
      break;
    default:
      break;
    case EShLangCompute:
      if (((*profile == EEsProfile) && (*version < 0x136)) ||
         ((*profile != EEsProfile && (*version < 0x1a4)))) {
        infoSink_local._7_1_ = false;
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: compute shaders require es profile with version 310 or above, or non-es profile with version 420 or above"
                  );
        iVar2 = 0x1a4;
        if (*profile == EEsProfile) {
          iVar2 = 0x136;
        }
        *version = iVar2;
      }
      break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
      if ((*profile == EEsProfile) || (*version < 0x1cc)) {
        infoSink_local._7_1_ = false;
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: ray tracing shaders require non-es profile with version 460 or above")
        ;
        *version = 0x1cc;
      }
      break;
    case EShLangTask:
    case EShLangMesh:
      if (((*profile == EEsProfile) && (*version < 0x140)) ||
         ((*profile != EEsProfile && (*version < 0x1c2)))) {
        infoSink_local._7_1_ = false;
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: mesh/task shaders require es profile with version 320 or above, or non-es profile with version 450 or above"
                  );
        iVar2 = 0x1c2;
        if (*profile == EEsProfile) {
          iVar2 = 0x140;
        }
        *version = iVar2;
      }
    }
    if (((*profile == EEsProfile) && (299 < *version)) && (versionNotFirst)) {
      infoSink_local._7_1_ = false;
      glslang::TInfoSinkBase::message
                (&infoSink->info,EPrefixError,
                 "#version: statement must appear first in es-profile shader; before comments or newlines"
                );
    }
    if (spvVersion->spv != 0) {
      if (*profile == ECompatibilityProfile) {
        glslang::TInfoSinkBase::message
                  (&infoSink->info,EPrefixError,
                   "#version: compilation for SPIR-V does not support the compatibility profile");
      }
      else if (*profile == EEsProfile) {
        if (*version < 0x136) {
          infoSink_local._7_1_ = false;
          glslang::TInfoSinkBase::message
                    (&infoSink->info,EPrefixError,
                     "#version: ES shaders for SPIR-V require version 310 or higher");
          *version = 0x136;
        }
      }
      else {
        if ((0 < spvVersion->vulkan) && (*version < 0x8c)) {
          infoSink_local._7_1_ = false;
          glslang::TInfoSinkBase::message
                    (&infoSink->info,EPrefixError,
                     "#version: Desktop shaders for Vulkan SPIR-V require version 140 or higher");
          *version = 0x8c;
        }
        if ((99 < spvVersion->openGl) && (*version < 0x14a)) {
          infoSink_local._7_1_ = false;
          glslang::TInfoSinkBase::message
                    (&infoSink->info,EPrefixError,
                     "#version: Desktop shaders for OpenGL SPIR-V require version 330 or higher");
          *version = 0x14a;
        }
      }
    }
  }
  return infoSink_local._7_1_;
}

Assistant:

bool DeduceVersionProfile(TInfoSink& infoSink, EShLanguage stage, bool versionNotFirst, int defaultVersion,
                          EShSource source, int& version, EProfile& profile, const SpvVersion& spvVersion)
{
    const int FirstProfileVersion = 150;
    bool correct = true;

    if (source == EShSourceHlsl) {
        version = 500;          // shader model; currently a characteristic of glslang, not the input
        profile = ECoreProfile; // allow doubles in prototype parsing
        return correct;
    }

    // Get a version...
    if (version == 0) {
        version = defaultVersion;
        // infoSink.info.message(EPrefixWarning, "#version: statement missing; use #version on first line of shader");
    }

    // Get a good profile...
    if (profile == ENoProfile) {
        if (version == 300 || version == 310 || version == 320) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: versions 300, 310, and 320 require specifying the 'es' profile");
            profile = EEsProfile;
        } else if (version == 100)
            profile = EEsProfile;
        else if (version >= FirstProfileVersion)
            profile = ECoreProfile;
        else
            profile = ENoProfile;
    } else {
        // a profile was provided...
        if (version < 150) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: versions before 150 do not allow a profile token");
            if (version == 100)
                profile = EEsProfile;
            else
                profile = ENoProfile;
        } else if (version == 300 || version == 310 || version == 320) {
            if (profile != EEsProfile) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: versions 300, 310, and 320 support only the es profile");
            }
            profile = EEsProfile;
        } else {
            if (profile == EEsProfile) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: only version 300, 310, and 320 support the es profile");
                if (version >= FirstProfileVersion)
                    profile = ECoreProfile;
                else
                    profile = ENoProfile;
            }
            // else: typical desktop case... e.g., "#version 410 core"
        }
    }

    // Fix version...
    switch (version) {
    // ES versions
    case 100: break;
    case 300: break;
    case 310: break;
    case 320: break;

    // desktop versions
    case 110: break;
    case 120: break;
    case 130: break;
    case 140: break;
    case 150: break;
    case 330: break;
    case 400: break;
    case 410: break;
    case 420: break;
    case 430: break;
    case 440: break;
    case 450: break;
    case 460: break;

    // unknown version
    default:
        correct = false;
        infoSink.info.message(EPrefixError, "version not supported");
        if (profile == EEsProfile)
            version = 310;
        else {
            version = 450;
            profile = ECoreProfile;
        }
        break;
    }

    // Correct for stage type...
    switch (stage) {
    case EShLangGeometry:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 150)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: geometry shaders require es profile with version 310 or non-es profile with version 150 or above");
            version = (profile == EEsProfile) ? 310 : 150;
            if (profile == EEsProfile || profile == ENoProfile)
                profile = ECoreProfile;
        }
        break;
    case EShLangTessControl:
    case EShLangTessEvaluation:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 150)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: tessellation shaders require es profile with version 310 or non-es profile with version 150 or above");
            version = (profile == EEsProfile) ? 310 : 400; // 150 supports the extension, correction is to 400 which does not
            if (profile == EEsProfile || profile == ENoProfile)
                profile = ECoreProfile;
        }
        break;
    case EShLangCompute:
        if ((profile == EEsProfile && version < 310) ||
            (profile != EEsProfile && version < 420)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: compute shaders require es profile with version 310 or above, or non-es profile with version 420 or above");
            version = profile == EEsProfile ? 310 : 420;
        }
        break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
        if (profile == EEsProfile || version < 460) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: ray tracing shaders require non-es profile with version 460 or above");
            version = 460;
        }
        break;
    case EShLangMesh:
    case EShLangTask:
        if ((profile == EEsProfile && version < 320) ||
            (profile != EEsProfile && version < 450)) {
            correct = false;
            infoSink.info.message(EPrefixError, "#version: mesh/task shaders require es profile with version 320 or above, or non-es profile with version 450 or above");
            version = profile == EEsProfile ? 320 : 450;
        }
        break;
    default:
        break;
    }

    if (profile == EEsProfile && version >= 300 && versionNotFirst) {
        correct = false;
        infoSink.info.message(EPrefixError, "#version: statement must appear first in es-profile shader; before comments or newlines");
    }

    // Check for SPIR-V compatibility
    if (spvVersion.spv != 0) {
        switch (profile) {
        case EEsProfile:
            if (version < 310) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: ES shaders for SPIR-V require version 310 or higher");
                version = 310;
            }
            break;
        case ECompatibilityProfile:
            infoSink.info.message(EPrefixError, "#version: compilation for SPIR-V does not support the compatibility profile");
            break;
        default:
            if (spvVersion.vulkan > 0 && version < 140) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: Desktop shaders for Vulkan SPIR-V require version 140 or higher");
                version = 140;
            }
            if (spvVersion.openGl >= 100 && version < 330) {
                correct = false;
                infoSink.info.message(EPrefixError, "#version: Desktop shaders for OpenGL SPIR-V require version 330 or higher");
                version = 330;
            }
            break;
        }
    }

    return correct;
}